

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int isDate(sqlite3_context *context,int argc,sqlite3_value **argv,DateTime *p)

{
  uchar uVar1;
  byte bVar2;
  Mem *pVal;
  double dVar3;
  byte bVar4;
  int iVar5;
  uint N;
  uint uVar6;
  uchar *zDate;
  byte *pbVar7;
  int iVar8;
  long lVar9;
  float *pfVar10;
  double dVar11;
  int iVar12;
  uchar *zDate_00;
  byte *pbVar13;
  byte *pbVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long in_FS_OFFSET;
  bool bVar18;
  ulong uStack_e0;
  int local_cc;
  double local_c8;
  int m;
  int h;
  int D;
  int M_1;
  int M;
  DateTime local_78;
  int Y;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p->s = 0.0;
  p->validJD = '\0';
  p->validYMD = '\0';
  p->validHMS = '\0';
  p->nFloor = '\0';
  *(undefined4 *)&p->field_0x2c = 0;
  p->D = 0;
  p->h = 0;
  p->m = 0;
  p->tz = 0;
  p->iJD = 0;
  p->Y = 0;
  p->M = 0;
  local_cc = 1;
  if (argc == 0) {
    iVar5 = sqlite3NotPureFunc(context);
    if (iVar5 != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        iVar5 = setDateTimeToCurrent(context,p);
        return iVar5;
      }
      goto LAB_001a08c0;
    }
  }
  else {
    pVal = *argv;
    if ("\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x04\x05\x03\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05"
        [pVal->flags & 0x3f] - 1 < 2) {
      dVar3 = sqlite3VdbeRealValue(pVal);
      setRawDateNumber(p,dVar3);
    }
    else {
      zDate = sqlite3_value_text(pVal);
      if (zDate == (uchar *)0x0) goto switchD_0019ffc4_caseD_62;
      _Y = (double)CONCAT44(uStack_3c,0xaaaaaaaa);
      M = -0x55555556;
      M_1 = -0x55555556;
      uVar1 = *zDate;
      uVar15 = (ulong)(uVar1 == '-');
      iVar5 = getDigits((char *)(zDate + uVar15),"40f-21a-21d");
      if (iVar5 == 3) {
        zDate_00 = zDate + uVar15 + 9;
        do {
          do {
            pbVar7 = zDate_00 + 1;
            zDate_00 = zDate_00 + 1;
          } while ((ulong)*pbVar7 == 0x54);
        } while ((""[*pbVar7] & 1) != 0);
        iVar5 = parseHhMmSs((char *)zDate_00,p);
        if (iVar5 != 0) {
          if (*zDate_00 != '\0') goto LAB_0019fcfa;
          p->validHMS = '\0';
        }
        p->validJD = '\0';
        p->validYMD = '\x01';
        iVar5 = -Y;
        if (uVar1 != '-') {
          iVar5 = Y;
        }
        p->Y = iVar5;
        p->M = M;
        p->D = M_1;
        computeFloor(p);
        if (p->tz != 0) {
          computeJD(p);
        }
      }
      else {
LAB_0019fcfa:
        iVar5 = parseHhMmSs((char *)zDate,p);
        if (iVar5 != 0) {
          iVar5 = sqlite3StrICmp((char *)zDate,"now");
          if ((iVar5 != 0) || (iVar5 = sqlite3NotPureFunc(context), iVar5 == 0)) {
            local_78.iJD = -1;
            iVar5 = sqlite3Strlen30((char *)zDate);
            iVar5 = sqlite3AtoF((char *)zDate,(double *)&local_78,iVar5,'\x01');
            if (0 < iVar5) {
              setRawDateNumber(p,(double)local_78.iJD);
              goto LAB_0019fe0e;
            }
            iVar5 = sqlite3StrICmp((char *)zDate,"subsec");
            if (((iVar5 != 0) && (iVar5 = sqlite3StrICmp((char *)zDate,"subsecond"), iVar5 != 0)) ||
               (iVar5 = sqlite3NotPureFunc(context), iVar5 == 0)) {
              local_cc = 1;
              goto switchD_0019ffc4_caseD_62;
            }
            p->field_0x2c = p->field_0x2c | 4;
          }
          iVar5 = setDateTimeToCurrent(context,p);
          if (iVar5 != 0) goto switchD_0019ffc4_caseD_62;
        }
      }
    }
LAB_0019fe0e:
    local_cc = 1;
    for (uVar15 = 1; (long)uVar15 < (long)argc; uVar15 = uVar15 + 1) {
      pbVar7 = sqlite3_value_text(argv[uVar15]);
      sqlite3_value_bytes(argv[uVar15]);
      if (pbVar7 == (byte *)0x0) goto switchD_0019ffc4_caseD_62;
      _Y = -NAN;
      bVar4 = *pbVar7;
      bVar2 = ""[bVar4];
      if (((ulong)bVar2 < 0x3a) && ((0x3ff280000000000U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
        M = -0x55555556;
        M_1 = -0x55555556;
        D = -0x55555556;
        h = -0x55555556;
        m = -0x55555556;
        pbVar13 = pbVar7 + 1;
        uVar16 = 1;
        while( true ) {
          bVar2 = pbVar7[uVar16];
          if (((bVar2 == 0) || (bVar2 == 0x3a)) || ((""[bVar2] & 1) != 0)) break;
          if (bVar2 == 0x2d) {
            if ((int)uVar16 == 6) {
              iVar5 = getDigits((char *)pbVar13,"50f",&M);
              if (iVar5 == 1) {
                uStack_e0 = 6;
                goto LAB_0019ff30;
              }
            }
            else if (((int)uVar16 == 5) && (iVar5 = getDigits((char *)pbVar13,"40f",&M), iVar5 == 1)
                    ) {
              uStack_e0 = 5;
              goto LAB_0019ff30;
            }
          }
          uVar16 = uVar16 + 1;
        }
        uStack_e0 = uVar16 & 0xffffffff;
LAB_0019ff30:
        iVar5 = sqlite3AtoF((char *)pbVar7,(double *)&Y,(int)uStack_e0,'\x01');
        uVar6 = 1;
        if (0 < iVar5) {
          pbVar14 = pbVar7;
          if (pbVar7[uVar16] == 0x2d) {
            if ((bVar4 == 0x2d) || (uVar6 = 1, bVar4 == 0x2b)) {
              if ((int)uStack_e0 == 5) {
                iVar5 = getDigits((char *)pbVar13,"40f-20a-20d",&M,&M_1,&D);
                pbVar13 = pbVar7;
              }
              else {
                iVar5 = getDigits((char *)pbVar13,"50f-20a-20d",&M,&M_1,&D);
              }
              iVar8 = M_1;
              iVar12 = D;
              uVar6 = 1;
              if ((iVar5 == 3) && (uVar6 = 1, D < 0x1f && M_1 < 0xc)) {
                computeYMD_HMS(p);
                p->validJD = '\0';
                iVar5 = M;
                if (bVar4 == 0x2d) {
                  iVar8 = -iVar8;
                  iVar12 = -iVar12;
                  iVar5 = -M;
                  D = iVar12;
                }
                iVar8 = p->M + iVar8;
                if (iVar8 < 1) {
                  uVar6 = -((0xcU - iVar8) / 0xc);
                }
                else {
                  uVar6 = (iVar8 - 1U) / 0xc;
                }
                p->Y = p->Y + iVar5 + uVar6;
                p->M = uVar6 * -0xc + iVar8;
                computeFloor(p);
                computeJD(p);
                p->validYMD = '\0';
                p->validHMS = '\0';
                p->iJD = p->iJD + (long)iVar12 * 86400000;
                if ((ulong)pbVar13[0xb] == 0) goto LAB_001a06ee;
                uVar6 = 1;
                if ((""[pbVar13[0xb]] & 1) != 0) {
                  iVar5 = getDigits((char *)(pbVar13 + 0xc),"20c:20e",&h,&m);
                  uStack_e0 = 2;
                  uVar6 = 1;
                  pbVar7 = pbVar13;
                  pbVar14 = pbVar13 + 0xc;
                  if (iVar5 == 2) goto LAB_001a003d;
                }
              }
            }
          }
          else {
LAB_001a003d:
            if (pbVar14[uStack_e0] == 0x3a) {
              local_78.s = 0.0;
              local_78.validJD = '\0';
              local_78.validYMD = '\0';
              local_78.validHMS = '\0';
              local_78.nFloor = '\0';
              local_78._44_4_ = 0;
              local_78.D = 0;
              local_78.h = 0;
              local_78.m = 0;
              local_78.tz = 0;
              local_78.iJD = 0;
              local_78.Y = 0;
              local_78.M = 0;
              iVar5 = parseHhMmSs((char *)(pbVar14 + ((ulong)*pbVar14 - 0x3a < 0xfffffffffffffff6)),
                                  &local_78);
              uVar6 = 1;
              if (iVar5 == 0) {
                computeJD(&local_78);
                lVar9 = (local_78.iJD + -43200000) % 86400000;
                lVar17 = -lVar9;
                if (bVar4 != 0x2d) {
                  lVar17 = lVar9;
                }
                computeJD(p);
                p->validYMD = '\0';
                p->validHMS = '\0';
                p->tz = 0;
                p->iJD = p->iJD + lVar17;
LAB_001a06ee:
                uVar6 = 0;
              }
            }
            else {
              pbVar7 = pbVar7 + (uStack_e0 - 1);
              do {
                pbVar13 = pbVar7 + 1;
                pbVar7 = pbVar7 + 1;
              } while ((""[*pbVar13] & 1) != 0);
              N = sqlite3Strlen30((char *)pbVar7);
              uVar6 = 1;
              if (0xfffffff7 < N - 0xb) {
                if ((pbVar7[N - 1] & 0xdf) == 0x53) {
                  N = N - 1;
                }
                computeJD(p);
                local_c8 = _Y;
                dVar3 = *(double *)(&DAT_001eaf20 + (ulong)(_Y < 0.0) * 8);
                p->nFloor = '\0';
                pfVar10 = &aXformType[0].rXform;
                for (lVar17 = 0; lVar17 != 6; lVar17 = lVar17 + 1) {
                  if ((((N == ((anon_struct_16_4_82cfffc4 *)(pfVar10 + -3))->nName) &&
                       (iVar5 = sqlite3_strnicmp((char *)((long)pfVar10 + -0xb),(char *)pbVar7,N),
                       iVar5 == 0)) && ((double)-pfVar10[-1] < local_c8)) &&
                     (local_c8 < (double)pfVar10[-1])) {
                    if ((int)lVar17 == 5) {
                      computeYMD_HMS(p);
                      p->Y = p->Y + (int)local_c8;
LAB_001a07fd:
                      computeFloor(p);
                      p->validJD = '\0';
                      local_c8 = local_c8 - (double)(int)local_c8;
                    }
                    else if ((int)lVar17 == 4) {
                      computeYMD_HMS(p);
                      iVar5 = p->M + (int)local_c8;
                      if (iVar5 == 0 || SCARRY4(p->M,(int)local_c8) != iVar5 < 0) {
                        uVar6 = -((0xcU - iVar5) / 0xc);
                      }
                      else {
                        uVar6 = (iVar5 - 1U) / 0xc;
                      }
                      p->Y = p->Y + uVar6;
                      p->M = uVar6 * -0xc + iVar5;
                      goto LAB_001a07fd;
                    }
                    computeJD(p);
                    p->iJD = p->iJD + (long)((double)*pfVar10 * local_c8 * 1000.0 + dVar3);
                    uVar6 = 0;
                    goto LAB_001a059e;
                  }
                  pfVar10 = pfVar10 + 4;
                }
                uVar6 = 1;
LAB_001a059e:
                p->validYMD = '\0';
                p->validHMS = '\0';
                p->tz = 0;
              }
            }
          }
        }
LAB_001a06fe:
        if (uVar6 == 0) goto LAB_001a0706;
        goto switchD_0019ffc4_caseD_62;
      }
      switch(bVar2) {
      case 0x61:
        iVar5 = sqlite3StrICmp((char *)pbVar7,"auto");
        if ((uVar15 < 2) && (iVar5 == 0)) {
          bVar4 = p->field_0x2c;
          if (((bVar4 & 1) != 0) && (p->validJD == '\0')) {
            dVar3 = p->s;
            if ((dVar3 < -210866760000.0) || (253402300799.0 < dVar3)) break;
            dVar3 = dVar3 * 1000.0 + 210866760000000.0;
LAB_001a074e:
            p->validHMS = '\0';
            p->tz = 0;
            p->iJD = (long)(dVar3 + 0.5);
            p->validJD = '\x01';
            p->validYMD = '\0';
          }
          goto LAB_001a076f;
        }
      case 0x62:
      case 100:
      case 0x65:
      case 0x67:
      case 0x68:
      case 0x69:
      case 0x6b:
        goto switchD_0019ffc4_caseD_62;
      case 99:
        iVar5 = sqlite3StrICmp((char *)pbVar7,"ceiling");
        if (iVar5 != 0) goto switchD_0019ffc4_caseD_62;
        computeJD(p);
        p->validYMD = '\0';
        p->validHMS = '\0';
        p->tz = 0;
        p->nFloor = '\0';
        break;
      case 0x66:
        iVar5 = sqlite3StrICmp((char *)pbVar7,"floor");
        if (iVar5 != 0) goto switchD_0019ffc4_caseD_62;
        computeJD(p);
        p->iJD = p->iJD - ((long)p->nFloor * 0x5265c0000000000 >> 0x20);
LAB_001a0403:
        p->validYMD = '\0';
        p->validHMS = '\0';
        p->tz = 0;
        break;
      case 0x6a:
        iVar5 = sqlite3StrICmp((char *)pbVar7,"julianday");
        if ((((1 < uVar15) || (iVar5 != 0)) || (p->validJD == '\0')) ||
           (bVar4 = p->field_0x2c, (bVar4 & 1) == 0)) goto switchD_0019ffc4_caseD_62;
LAB_001a076f:
        p->field_0x2c = bVar4 & 0xfe;
        break;
      case 0x6c:
        iVar5 = sqlite3StrICmp((char *)pbVar7,"localtime");
        if ((iVar5 == 0) && (iVar5 = sqlite3NotPureFunc(context), iVar5 != 0)) {
          bVar4 = p->field_0x2c;
          uVar6 = 0;
          if ((bVar4 & 0x10) == 0) {
            uVar6 = toLocaltime(p,context);
            bVar4 = p->field_0x2c;
          }
          p->field_0x2c = bVar4 & 0xe7 | 0x10;
          goto LAB_001a06fe;
        }
        goto switchD_0019ffc4_caseD_62;
      default:
        if (bVar2 == 0x73) {
          iVar5 = sqlite3_strnicmp((char *)pbVar7,"start of ",9);
          if (iVar5 == 0) {
            if (((p->validJD == '\0') && (p->validYMD == '\0')) && (p->validHMS == '\0'))
            goto switchD_0019ffc4_caseD_62;
            pbVar7 = pbVar7 + 9;
            computeYMD(p);
            p->validHMS = '\x01';
            p->h = 0;
            p->m = 0;
            p->s = 0.0;
            p->field_0x2c = p->field_0x2c & 0xfe;
            p->tz = 0;
            p->validJD = '\0';
            iVar5 = sqlite3StrICmp((char *)pbVar7,"month");
            if (iVar5 == 0) {
              p->D = 1;
            }
            else {
              iVar5 = sqlite3StrICmp((char *)pbVar7,"year");
              if (iVar5 != 0) {
                iVar5 = sqlite3StrICmp((char *)pbVar7,"day");
                uVar6 = (uint)(iVar5 != 0);
                goto LAB_001a06fe;
              }
              p->M = 1;
              p->D = 1;
            }
          }
          else {
            iVar5 = sqlite3StrICmp((char *)pbVar7,"subsec");
            if ((iVar5 != 0) && (iVar5 = sqlite3StrICmp((char *)pbVar7,"subsecond"), iVar5 != 0))
            goto switchD_0019ffc4_caseD_62;
            p->field_0x2c = p->field_0x2c | 4;
          }
        }
        else {
          if (bVar2 != 0x75) {
            if ((bVar2 == 0x77) &&
               (iVar5 = sqlite3_strnicmp((char *)pbVar7,"weekday ",8), iVar5 == 0)) {
              iVar5 = sqlite3Strlen30((char *)(pbVar7 + 8));
              iVar5 = sqlite3AtoF((char *)(pbVar7 + 8),(double *)&Y,iVar5,'\x01');
              if ((0 < iVar5) && ((0.0 <= _Y && (_Y < 7.0)))) {
                if ((_Y == (double)(int)_Y) && (!NAN(_Y) && !NAN((double)(int)_Y))) {
                  iVar5 = (int)_Y;
                  computeYMD_HMS(p);
                  p->tz = 0;
                  p->validJD = '\0';
                  computeJD(p);
                  lVar17 = ((p->iJD + 0x7b98a00) / 86400000) % 7;
                  if (iVar5 < lVar17) {
                    lVar17 = lVar17 + -7;
                  }
                  p->iJD = (iVar5 - lVar17) * 86400000 + p->iJD;
                  goto LAB_001a0403;
                }
              }
            }
            goto switchD_0019ffc4_caseD_62;
          }
          iVar5 = sqlite3StrICmp((char *)pbVar7,"unixepoch");
          if ((iVar5 == 0) && (bVar4 = p->field_0x2c, (bVar4 & 1) != 0)) {
            if (((uVar15 < 2) && (dVar3 = p->s * 1000.0 + 210866760000000.0, 0.0 <= dVar3)) &&
               (dVar3 < 464269060800000.0)) goto LAB_001a074e;
            goto switchD_0019ffc4_caseD_62;
          }
          iVar5 = sqlite3StrICmp((char *)pbVar7,"utc");
          if ((iVar5 != 0) || (iVar5 = sqlite3NotPureFunc(context), iVar5 == 0))
          goto switchD_0019ffc4_caseD_62;
          if ((p->field_0x2c & 8) == 0) {
            computeJD(p);
            dVar3 = (double)p->iJD;
            lVar17 = 0;
            dVar11 = dVar3;
            uVar6 = 0;
            do {
              dVar11 = (double)((long)dVar11 - lVar17);
              local_78.m = 0;
              local_78.tz = 0;
              local_78.s = 0.0;
              local_78.Y = 0;
              local_78.M = 0;
              local_78.D = 0;
              local_78.h = 0;
              local_78.validJD = '\x01';
              local_78.validYMD = '\0';
              local_78.validHMS = '\0';
              local_78.nFloor = '\0';
              local_78._44_4_ = 0;
              local_78.iJD = (sqlite3_int64)dVar11;
              iVar5 = toLocaltime(&local_78,context);
              if (iVar5 != 0) goto switchD_0019ffc4_caseD_62;
              computeJD(&local_78);
              lVar17 = local_78.iJD - (long)dVar3;
            } while ((lVar17 != 0) && (bVar18 = uVar6 < 3, uVar6 = uVar6 + 1, bVar18));
            p->iJD = 0;
            p->Y = 0;
            p->M = 0;
            p->s = 0.0;
            p->validJD = '\0';
            p->validYMD = '\0';
            p->validHMS = '\0';
            p->nFloor = '\0';
            *(undefined4 *)&p->field_0x2c = 0;
            p->D = 0;
            p->h = 0;
            p->m = 0;
            p->tz = 0;
            p->iJD = (sqlite3_int64)dVar11;
            p->validJD = '\x01';
            p->field_0x2c = p->field_0x2c & 0xe7 | 8;
          }
        }
      }
LAB_001a0706:
    }
    computeJD(p);
    if (((((p->field_0x2c & 2) == 0) && ((ulong)p->iJD < 0x1a6401072fe00)) &&
        (local_cc = 0, argc == 1)) && ((p->validYMD != '\0' && (0x1c < p->D)))) {
      p->validYMD = '\0';
    }
  }
switchD_0019ffc4_caseD_62:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return local_cc;
  }
LAB_001a08c0:
  __stack_chk_fail();
}

Assistant:

static int isDate(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv,
  DateTime *p
){
  int i, n;
  const unsigned char *z;
  int eType;
  memset(p, 0, sizeof(*p));
  if( argc==0 ){
    if( !sqlite3NotPureFunc(context) ) return 1;
    return setDateTimeToCurrent(context, p);
  }
  if( (eType = sqlite3_value_type(argv[0]))==SQLITE_FLOAT
                   || eType==SQLITE_INTEGER ){
    setRawDateNumber(p, sqlite3_value_double(argv[0]));
  }else{
    z = sqlite3_value_text(argv[0]);
    if( !z || parseDateOrTime(context, (char*)z, p) ){
      return 1;
    }
  }
  for(i=1; i<argc; i++){
    z = sqlite3_value_text(argv[i]);
    n = sqlite3_value_bytes(argv[i]);
    if( z==0 || parseModifier(context, (char*)z, n, p, i) ) return 1;
  }
  computeJD(p);
  if( p->isError || !validJulianDay(p->iJD) ) return 1;
  if( argc==1 && p->validYMD && p->D>28 ){
    /* Make sure a YYYY-MM-DD is normalized.
    ** Example: 2023-02-31 -> 2023-03-03 */
    assert( p->validJD );
    p->validYMD = 0;
  }
  return 0;
}